

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

cl_int __thiscall
CLIntercept::getDeviceMajorMinorVersion
          (CLIntercept *this,cl_device_id device,size_t *majorVersion,size_t *minorVersion)

{
  char *pcVar1;
  cl_int cVar2;
  char *deviceVersion;
  char *local_28;
  
  local_28 = (char *)0x0;
  cVar2 = allocateAndGetDeviceInfoString(this,device,0x102f,&local_28);
  pcVar1 = local_28;
  if (local_28 != (char *)0x0 && cVar2 == 0) {
    getMajorMinorVersionFromString(this,"OpenCL ",local_28,majorVersion,minorVersion);
  }
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  return cVar2;
}

Assistant:

cl_int CLIntercept::getDeviceMajorMinorVersion(
    cl_device_id device,
    size_t& majorVersion,
    size_t& minorVersion ) const
{
    char*   deviceVersion = NULL;

    cl_int  errorCode = allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_VERSION,
        deviceVersion );
    if( errorCode == CL_SUCCESS && deviceVersion )
    {
        // According to the spec, the device version string should have the form:
        //   OpenCL <Major>.<Minor> <Vendor Specific Info>
        getMajorMinorVersionFromString(
            "OpenCL ",
            deviceVersion,
            majorVersion,
            minorVersion );
    }

    delete [] deviceVersion;
    deviceVersion = NULL;

    return errorCode;
}